

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVRFile.cpp
# Opt level: O0

char * nextfield(char *p)

{
  bool bVar1;
  char *p_local;
  
  p_local = p;
  if (p != (char *)0x0) {
    while( true ) {
      bVar1 = false;
      if (((*p_local != '\t') && (bVar1 = false, *p_local != '\0')) &&
         (bVar1 = false, *p_local != '\r')) {
        bVar1 = *p_local != '\n';
      }
      if (!bVar1) break;
      p_local = p_local + 1;
    }
  }
  if (*p_local == '\t') {
    p_local = p_local + 1;
  }
  return p_local;
}

Assistant:

char *nextfield(char *p) {
	if (p) {
		while ((*p != '\t') && (*p != '\0') && (*p != '\r') && (*p != '\n')) {
			p++;
		}
	}
	if (*p == '\t') p++;
	return p;
}